

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O0

void __thiscall S2Polygon::S2Polygon(S2Polygon *this)

{
  S2Polygon *this_local;
  
  S2Region::S2Region(&this->super_S2Region);
  (this->super_S2Region)._vptr_S2Region = (_func_int **)&PTR__S2Polygon_0062ea50;
  std::
  vector<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
  ::vector(&this->loops_);
  this->s2debug_override_ = ALLOW;
  this->error_inconsistent_loop_orientations_ = '\0';
  this->num_vertices_ = 0;
  std::atomic<int>::atomic(&this->unindexed_contains_calls_,0);
  S2LatLngRect::S2LatLngRect(&this->bound_);
  S2LatLngRect::S2LatLngRect(&this->subregion_bound_);
  MutableS2ShapeIndex::MutableS2ShapeIndex(&this->index_);
  return;
}

Assistant:

S2Polygon::S2Polygon()
    : s2debug_override_(S2Debug::ALLOW),
      error_inconsistent_loop_orientations_(false),
      num_vertices_(0),
      unindexed_contains_calls_(0) {
}